

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argon2.c
# Opt level: O2

int argon2_ctx_mem(argon2_context *context,argon2_type type,void *memory,size_t memory_size)

{
  uint uVar1;
  int iVar2;
  argon2_instance_t instance;
  
  iVar2 = validate_inputs(context);
  if (iVar2 == 0) {
    if (type < (Argon2_id|Argon2_i)) {
      instance.lanes = context->lanes;
      uVar1 = context->m_cost;
      if (context->m_cost < instance.lanes * 8) {
        uVar1 = instance.lanes * 8;
      }
      instance.segment_length = uVar1 / (instance.lanes * 4);
      instance.memory_blocks = instance.lanes * 4 * instance.segment_length;
      if (memory != (void *)0x0) {
        if ((memory_size & 0x3ff) != 0) {
          return -0x16;
        }
        if (memory_size >> 10 < (ulong)instance.memory_blocks) {
          return -0x16;
        }
      }
      instance.version = context->version;
      instance.passes = context->t_cost;
      instance.lane_length = instance.segment_length << 2;
      instance.threads = context->threads;
      instance.print_internals = context->flags >> 3 & 1;
      instance.keep_memory = (int)(memory != (void *)0x0);
      if (instance.lanes < instance.threads) {
        instance.threads = instance.lanes;
      }
      instance.memory = (block *)memory;
      instance.type = type;
      iVar2 = initialize(&instance,context);
      if ((iVar2 == 0) && (iVar2 = fill_memory_blocks(&instance), iVar2 == 0)) {
        finalize(context,&instance);
        iVar2 = 0;
      }
    }
    else {
      iVar2 = -0x1a;
    }
  }
  return iVar2;
}

Assistant:

int argon2_ctx_mem(argon2_context *context, argon2_type type, void *memory,
                   size_t memory_size) {
    /* 1. Validate all inputs */
    int result = validate_inputs(context);
    uint32_t memory_blocks, segment_length;
    argon2_instance_t instance;

    if (ARGON2_OK != result) {
        return result;
    }

    if (Argon2_d != type && Argon2_i != type && Argon2_id != type) {
        return ARGON2_INCORRECT_TYPE;
    }

    /* 2. Align memory size */
    argon2_compute_memory_blocks(&memory_blocks, &segment_length,
                                 context->m_cost, context->lanes);

    /* check for sufficient memory size: */
    if (memory != NULL && (memory_size % ARGON2_BLOCK_SIZE != 0 ||
                           memory_size / ARGON2_BLOCK_SIZE < memory_blocks)) {
        return ARGON2_MEMORY_ALLOCATION_ERROR;
    }

    instance.version = context->version;
    instance.memory = (block *)memory;
    instance.passes = context->t_cost;
    instance.memory_blocks = memory_blocks;
    instance.segment_length = segment_length;
    instance.lane_length = segment_length * ARGON2_SYNC_POINTS;
    instance.lanes = context->lanes;
    instance.threads = context->threads;
    instance.type = type;
    instance.print_internals = !!(context->flags & ARGON2_FLAG_GENKAT);
    instance.keep_memory = memory != NULL;

    if (instance.threads > instance.lanes) {
        instance.threads = instance.lanes;
    }

    /* 3. Initialization: Hashing inputs, allocating memory, filling first
     * blocks
     */
    result = initialize(&instance, context);

    if (ARGON2_OK != result) {
        return result;
    }

    /* 4. Filling memory */
    result = fill_memory_blocks(&instance);

    if (ARGON2_OK != result) {
        return result;
    }
    /* 5. Finalization */
    finalize(context, &instance);

    return ARGON2_OK;
}